

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

bool __thiscall osc::ReceivedMessageArgument::AsBool(ReceivedMessageArgument *this)

{
  MissingArgumentException *this_00;
  WrongArgumentTypeException *this_01;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  if (*this->typeTagPtr_ == 'T') {
    this_local._7_1_ = true;
  }
  else {
    if (*this->typeTagPtr_ != 'F') {
      this_01 = (WrongArgumentTypeException *)__cxa_allocate_exception(0x10);
      WrongArgumentTypeException::WrongArgumentTypeException(this_01,"wrong argument type");
      __cxa_throw(this_01,&WrongArgumentTypeException::typeinfo,
                  WrongArgumentTypeException::~WrongArgumentTypeException);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ReceivedMessageArgument::AsBool() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TRUE_TYPE_TAG )
		return true;
	else if( *typeTagPtr_ == FALSE_TYPE_TAG )
		return false;
	else
		throw WrongArgumentTypeException();
}